

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::CreateBoundStructExtractIndex
          (duckdb *this,ClientContext *context,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          idx_t key)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false> _Var2;
  char cVar3;
  BoundConstantExpression *this_00;
  pointer pBVar4;
  long *plVar5;
  idx_t iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer *__ptr;
  char cVar8;
  templated_unique_single_t result;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_info;
  string __str;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  LogicalType return_type;
  ScalarFunction extract_function;
  _Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false> local_1f8;
  undefined1 local_1f0 [40];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_1c8;
  LogicalType local_1a8;
  _Alloc_hider local_190;
  element_type *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [3];
  ScalarFunction local_150;
  
  local_1c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&local_1c8,expr);
  Value::BIGINT((Value *)&local_190,key);
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value((Value *)&local_150,(Value *)&local_190);
  BoundConstantExpression::BoundConstantExpression(this_00,(Value *)&local_150);
  Value::~Value((Value *)&local_150);
  local_1f0._8_8_ = this_00;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&local_1c8,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             (local_1f0 + 8));
  if ((BoundConstantExpression *)local_1f0._8_8_ != (BoundConstantExpression *)0x0) {
    (*(((Expression *)local_1f0._8_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_1f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Value::~Value((Value *)&local_190);
  GetIndexExtractFunction();
  (*local_150.bind)((ClientContext *)local_1f0,(ScalarFunction *)context,
                    (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     *)&local_150);
  LogicalType::LogicalType(&local_1a8,&local_150.super_BaseScalarFunction.return_type);
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&local_1f8,&local_1a8,&local_150,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_1c8,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             local_1f0);
  pBVar4 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                         *)&local_1f8);
  cVar8 = '\x01';
  if (9 < key) {
    iVar6 = key;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (iVar6 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00da1ad3;
      }
      if (iVar6 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00da1ad3;
      }
      if (iVar6 < 10000) goto LAB_00da1ad3;
      bVar1 = 99999 < iVar6;
      iVar6 = iVar6 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_00da1ad3:
  local_1f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f0 + 0x18);
  ::std::__cxx11::string::_M_construct((ulong)(local_1f0 + 8),cVar8);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1f0._8_8_,local_1f0._16_4_,key);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)(local_1f0 + 8),0,(char *)0x0,0x1dd6972);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar7) {
    local_180[0]._0_8_ = paVar7->_M_allocated_capacity;
    local_180[0]._8_8_ = plVar5[3];
    local_190._M_p = (pointer)local_180;
  }
  else {
    local_180[0]._0_8_ = paVar7->_M_allocated_capacity;
    local_190._M_p = (pointer)*plVar5;
  }
  local_188 = (element_type *)plVar5[1];
  *plVar5 = (long)paVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::operator=
            ((string *)&(pBVar4->super_Expression).super_BaseExpression.alias,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f0 + 0x18)) {
    operator_delete((void *)local_1f0._8_8_);
  }
  _Var2._M_head_impl = local_1f8._M_head_impl;
  local_1f8._M_head_impl = (BoundFunctionExpression *)0x0;
  *(BoundFunctionExpression **)this = _Var2._M_head_impl;
  LogicalType::~LogicalType(&local_1a8);
  if ((__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>)
      local_1f0._0_8_ !=
      (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)0x0) {
    (**(code **)(*(long *)local_1f0._0_8_ + 8))();
  }
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.function.super__Function_base._M_manager)
              ((_Any_data *)&local_150.function,(_Any_data *)&local_150.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_1c8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> CreateBoundStructExtractIndex(ClientContext &context, unique_ptr<Expression> expr, idx_t key) {
	vector<unique_ptr<Expression>> arguments;
	arguments.push_back(std::move(expr));
	arguments.push_back(make_uniq<BoundConstantExpression>(Value::BIGINT(int64_t(key))));
	auto extract_function = GetIndexExtractFunction();
	auto bind_info = extract_function.bind(context, extract_function, arguments);
	auto return_type = extract_function.return_type;
	auto result = make_uniq<BoundFunctionExpression>(return_type, std::move(extract_function), std::move(arguments),
	                                                 std::move(bind_info));
	result->SetAlias("element" + to_string(key));
	return std::move(result);
}